

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O0

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_180;
  char *local_178;
  undefined1 auStack_168 [4];
  int r;
  uv_buf_t buf;
  uv_udp_send_t req;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&req.bufsml[3].len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0x9b,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0x9e,"r == 0");
    abort();
  }
  iVar1 = uv_udp_bind(&server,(sockaddr *)&req.bufsml[3].len,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xa1,"r == 0");
    abort();
  }
  iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xa4,"r == 0");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&req.bufsml[3].len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xa6,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xa9,"r == 0");
    abort();
  }
  uVar3 = uv_buf_init("PING",4);
  local_180 = uVar3.base;
  _auStack_168 = local_180;
  local_178 = (char *)uVar3.len;
  buf.base = local_178;
  iVar1 = uv_udp_send((uv_udp_send_t *)&buf.len,&client,(uv_buf_t *)auStack_168,1,
                      (sockaddr *)&req.bufsml[3].len,cl_send_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xb2,"r == 0");
    abort();
  }
  if (close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xb4,"close_cb_called == 0");
    abort();
  }
  if (cl_send_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xb5,"cl_send_cb_called == 0");
    abort();
  }
  if (cl_recv_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xb6,"cl_recv_cb_called == 0");
    abort();
  }
  if (sv_send_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xb7,"sv_send_cb_called == 0");
    abort();
  }
  if (sv_recv_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xb8,"sv_recv_cb_called == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (cl_send_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xbc,"cl_send_cb_called == 1");
    abort();
  }
  if (cl_recv_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xbd,"cl_recv_cb_called == 1");
    abort();
  }
  if (sv_send_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xbe,"sv_send_cb_called == 1");
    abort();
  }
  if (sv_recv_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xbf,"sv_recv_cb_called == 1");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xc0,"close_cb_called == 2");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
            ,0xc2,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_send_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);
  ASSERT(sv_recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_send_cb_called == 1);
  ASSERT(cl_recv_cb_called == 1);
  ASSERT(sv_send_cb_called == 1);
  ASSERT(sv_recv_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}